

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::RenderRectFilledRangeH
               (ImDrawList *draw_list,ImRect *rect,ImU32 col,float x_start_norm,float x_end_norm,
               float rounding)

{
  ImVec2 *pIVar1;
  ImVec2 *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  float fVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar8;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  ImVec2 p1;
  ImVec2 p0;
  ImVec2 local_a0;
  float local_98;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_5c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  ImVec2 local_40;
  ImVec2 local_38;
  
  if ((x_end_norm == x_start_norm) && (!NAN(x_end_norm) && !NAN(x_start_norm))) {
    return;
  }
  fVar8 = x_end_norm;
  if (x_start_norm <= x_end_norm) {
    fVar8 = x_start_norm;
    x_start_norm = x_end_norm;
  }
  fVar7 = (rect->Min).x;
  local_88 = (rect->Min).y;
  fVar11 = (rect->Max).x - fVar7;
  local_78 = fVar8 * fVar11 + fVar7;
  fVar10 = x_start_norm * fVar11 + fVar7;
  fVar8 = (rect->Max).y;
  local_40.x = fVar10;
  local_40.y = fVar8;
  local_38.x = local_78;
  local_38.y = local_88;
  if ((rounding != 0.0) || (NAN(rounding))) {
    fVar9 = (fVar8 - local_88) * 0.5;
    fVar12 = fVar11 * 0.5;
    if (fVar9 <= fVar11 * 0.5) {
      fVar12 = fVar9;
    }
    fVar12 = fVar12 + -1.0;
    if (fVar12 <= rounding) {
      rounding = fVar12;
    }
    local_98 = (float)(~-(uint)(fVar12 < 0.0) & (uint)rounding);
    fVar12 = 1.0 / local_98;
    fVar7 = 1.0 - (local_78 - fVar7) * fVar12;
    fVar11 = 1.5707964;
    uStack_74 = in_XMM1_Db;
    uStack_70 = in_XMM1_Dc;
    uStack_6c = in_XMM1_Dd;
    if ((0.0 < fVar7) && (fVar11 = 0.0, fVar7 < 1.0)) {
      fVar11 = acosf(fVar7);
    }
    fVar9 = 1.5707964;
    fVar7 = 1.0 - (fVar10 - (rect->Min).x) * fVar12;
    if ((0.0 < fVar7) && (fVar9 = 0.0, fVar7 < 1.0)) {
      fVar9 = acosf(fVar7);
    }
    fVar7 = (rect->Min).x + local_98;
    uVar6 = -(uint)(fVar7 <= local_78);
    fVar7 = (float)(uVar6 & (uint)local_78 | ~uVar6 & (uint)fVar7);
    if ((fVar11 != fVar9) || (NAN(fVar11) || NAN(fVar9))) {
      local_a0.y = fVar8 - local_98;
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      local_a0.x = fVar7;
      if ((fVar11 != 0.0) || (((NAN(fVar11) || (fVar9 != 1.5707964)) || (NAN(fVar9))))) {
        local_5c = fVar9;
        local_58 = fVar7;
        ImDrawList::PathArcTo(draw_list,&local_a0,local_98,3.1415927 - fVar9,3.1415927 - fVar11,0);
        local_a0.y = local_88 + local_98;
        local_a0.x = local_58;
        ImDrawList::PathArcTo
                  (draw_list,&local_a0,local_98,fVar11 + 3.1415927,local_5c + 3.1415927,0);
      }
      else {
        local_58 = fVar7;
        ImDrawList::PathArcToFast(draw_list,&local_a0,local_98,3,6);
        local_a0.y = local_88 + local_98;
        local_a0.x = local_58;
        ImDrawList::PathArcToFast(draw_list,&local_a0,local_98,6,9);
      }
    }
    else {
      iVar4 = (draw_list->_Path).Size;
      iVar5 = (draw_list->_Path).Capacity;
      uVar16 = 0;
      uVar17 = 0;
      uVar18 = 0;
      if (iVar4 == iVar5) {
        iVar4 = iVar4 + 1;
        if (iVar5 == 0) {
          iVar3 = 8;
        }
        else {
          iVar3 = iVar5 / 2 + iVar5;
        }
        if (iVar4 < iVar3) {
          iVar4 = iVar3;
        }
        if (iVar5 < iVar4) {
          uStack_54 = 0;
          uStack_50 = 0;
          uStack_4c = 0;
          local_58 = fVar7;
          pIVar2 = (ImVec2 *)MemAlloc((long)iVar4 << 3);
          pIVar1 = (draw_list->_Path).Data;
          if (pIVar1 != (ImVec2 *)0x0) {
            memcpy(pIVar2,pIVar1,(long)(draw_list->_Path).Size << 3);
            MemFree((draw_list->_Path).Data);
          }
          (draw_list->_Path).Data = pIVar2;
          (draw_list->_Path).Capacity = iVar4;
          fVar7 = local_58;
          uVar16 = uStack_54;
          uVar17 = uStack_50;
          uVar18 = uStack_4c;
        }
      }
      pIVar1 = (draw_list->_Path).Data;
      iVar4 = (draw_list->_Path).Size;
      pIVar1[iVar4].x = fVar7;
      pIVar1[iVar4].y = fVar8;
      iVar5 = (draw_list->_Path).Size;
      iVar3 = (draw_list->_Path).Capacity;
      iVar4 = iVar5 + 1;
      (draw_list->_Path).Size = iVar4;
      if (iVar4 == iVar3) {
        iVar5 = iVar5 + 2;
        if (iVar3 == 0) {
          iVar4 = 8;
        }
        else {
          iVar4 = iVar3 / 2 + iVar3;
        }
        if (iVar5 < iVar4) {
          iVar5 = iVar4;
        }
        if (iVar3 < iVar5) {
          local_58 = fVar7;
          uStack_54 = uVar16;
          uStack_50 = uVar17;
          uStack_4c = uVar18;
          pIVar2 = (ImVec2 *)MemAlloc((long)iVar5 << 3);
          pIVar1 = (draw_list->_Path).Data;
          if (pIVar1 != (ImVec2 *)0x0) {
            memcpy(pIVar2,pIVar1,(long)(draw_list->_Path).Size << 3);
            MemFree((draw_list->_Path).Data);
          }
          (draw_list->_Path).Data = pIVar2;
          (draw_list->_Path).Capacity = iVar5;
          fVar7 = local_58;
        }
      }
      pIVar1 = (draw_list->_Path).Data;
      iVar4 = (draw_list->_Path).Size;
      pIVar1[iVar4].x = fVar7;
      pIVar1[iVar4].y = local_88;
      (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
    }
    if ((rect->Min).x + local_98 < fVar10) {
      fVar11 = 1.0 - ((rect->Max).x - fVar10) * fVar12;
      fVar7 = 1.5707964;
      uVar16 = 0;
      uVar17 = 0;
      uVar18 = 0;
      if (0.0 < fVar11) {
        fVar7 = 0.0;
        uVar16 = 0;
        uVar17 = 0;
        uVar18 = 0;
        if (fVar11 < 1.0) {
          fVar7 = acosf(fVar11);
          uVar16 = extraout_XMM0_Db;
          uVar17 = extraout_XMM0_Dc;
          uVar18 = extraout_XMM0_Dd;
        }
      }
      uVar15 = 0;
      uVar14 = 0;
      uVar13 = 0;
      fVar11 = 1.5707964;
      fVar12 = 1.0 - ((rect->Max).x - local_78) * fVar12;
      if (0.0 < fVar12) {
        fVar11 = 0.0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        if (fVar12 < 1.0) {
          local_78 = fVar7;
          uStack_74 = uVar16;
          uStack_70 = uVar17;
          uStack_6c = uVar18;
          fVar11 = acosf(fVar12);
          fVar7 = local_78;
          uVar16 = uStack_74;
          uVar17 = uStack_70;
          uVar18 = uStack_6c;
          uVar13 = extraout_XMM0_Db_00;
          uVar14 = extraout_XMM0_Dc_00;
          uVar15 = extraout_XMM0_Dd_00;
        }
      }
      fVar12 = (rect->Max).x - local_98;
      if (fVar12 <= fVar10) {
        fVar10 = fVar12;
      }
      if ((fVar7 != fVar11) || (NAN(fVar7) || NAN(fVar11))) {
        local_a0.y = local_88 + local_98;
        local_a0.x = fVar10;
        if (((fVar7 != 0.0) || ((NAN(fVar7) || (fVar11 != 1.5707964)))) || (NAN(fVar11))) {
          local_88 = fVar11;
          uStack_84 = uVar13;
          uStack_80 = uVar14;
          uStack_7c = uVar15;
          local_78 = fVar7;
          uStack_74 = uVar16;
          uStack_70 = uVar17;
          uStack_6c = uVar18;
          ImDrawList::PathArcTo(draw_list,&local_a0,local_98,-fVar11,-fVar7,0);
          local_a0.y = fVar8 - local_98;
          local_a0.x = fVar10;
          ImDrawList::PathArcTo(draw_list,&local_a0,local_98,local_78,local_88,0);
        }
        else {
          ImDrawList::PathArcToFast(draw_list,&local_a0,local_98,9,0xc);
          local_a0.y = fVar8 - local_98;
          local_a0.x = fVar10;
          ImDrawList::PathArcToFast(draw_list,&local_a0,local_98,0,3);
        }
      }
      else {
        iVar4 = (draw_list->_Path).Size;
        iVar5 = (draw_list->_Path).Capacity;
        if (iVar4 == iVar5) {
          iVar4 = iVar4 + 1;
          if (iVar5 == 0) {
            iVar3 = 8;
          }
          else {
            iVar3 = iVar5 / 2 + iVar5;
          }
          if (iVar4 < iVar3) {
            iVar4 = iVar3;
          }
          if (iVar5 < iVar4) {
            pIVar2 = (ImVec2 *)MemAlloc((long)iVar4 << 3);
            pIVar1 = (draw_list->_Path).Data;
            if (pIVar1 != (ImVec2 *)0x0) {
              memcpy(pIVar2,pIVar1,(long)(draw_list->_Path).Size << 3);
              MemFree((draw_list->_Path).Data);
            }
            (draw_list->_Path).Data = pIVar2;
            (draw_list->_Path).Capacity = iVar4;
          }
        }
        pIVar1 = (draw_list->_Path).Data;
        iVar4 = (draw_list->_Path).Size;
        pIVar1[iVar4].x = fVar10;
        pIVar1[iVar4].y = local_88;
        iVar5 = (draw_list->_Path).Size;
        iVar3 = (draw_list->_Path).Capacity;
        iVar4 = iVar5 + 1;
        (draw_list->_Path).Size = iVar4;
        if (iVar4 == iVar3) {
          iVar5 = iVar5 + 2;
          if (iVar3 == 0) {
            iVar4 = 8;
          }
          else {
            iVar4 = iVar3 / 2 + iVar3;
          }
          if (iVar5 < iVar4) {
            iVar5 = iVar4;
          }
          if (iVar3 < iVar5) {
            pIVar2 = (ImVec2 *)MemAlloc((long)iVar5 << 3);
            pIVar1 = (draw_list->_Path).Data;
            if (pIVar1 != (ImVec2 *)0x0) {
              memcpy(pIVar2,pIVar1,(long)(draw_list->_Path).Size << 3);
              MemFree((draw_list->_Path).Data);
            }
            (draw_list->_Path).Data = pIVar2;
            (draw_list->_Path).Capacity = iVar5;
          }
        }
        pIVar1 = (draw_list->_Path).Data;
        iVar4 = (draw_list->_Path).Size;
        pIVar1[iVar4].x = fVar10;
        pIVar1[iVar4].y = fVar8;
        (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
      }
    }
    ImDrawList::AddConvexPolyFilled(draw_list,(draw_list->_Path).Data,(draw_list->_Path).Size,col);
    (draw_list->_Path).Size = 0;
  }
  else if (0xffffff < col) {
    ImDrawList::PrimReserve(draw_list,6,4);
    ImDrawList::PrimRect(draw_list,&local_38,&local_40,col);
  }
  return;
}

Assistant:

void ImGui::RenderRectFilledRangeH(ImDrawList* draw_list, const ImRect& rect, ImU32 col, float x_start_norm, float x_end_norm, float rounding)
{
    if (x_end_norm == x_start_norm)
        return;
    if (x_start_norm > x_end_norm)
        ImSwap(x_start_norm, x_end_norm);

    ImVec2 p0 = ImVec2(ImLerp(rect.Min.x, rect.Max.x, x_start_norm), rect.Min.y);
    ImVec2 p1 = ImVec2(ImLerp(rect.Min.x, rect.Max.x, x_end_norm), rect.Max.y);
    if (rounding == 0.0f)
    {
        draw_list->AddRectFilled(p0, p1, col, 0.0f);
        return;
    }

    rounding = ImClamp(ImMin((rect.Max.x - rect.Min.x) * 0.5f, (rect.Max.y - rect.Min.y) * 0.5f) - 1.0f, 0.0f, rounding);
    const float inv_rounding = 1.0f / rounding;
    const float arc0_b = ImAcos01(1.0f - (p0.x - rect.Min.x) * inv_rounding);
    const float arc0_e = ImAcos01(1.0f - (p1.x - rect.Min.x) * inv_rounding);
    const float half_pi = IM_PI * 0.5f; // We will == compare to this because we know this is the exact value ImAcos01 can return.
    const float x0 = ImMax(p0.x, rect.Min.x + rounding);
    if (arc0_b == arc0_e)
    {
        draw_list->PathLineTo(ImVec2(x0, p1.y));
        draw_list->PathLineTo(ImVec2(x0, p0.y));
    }
    else if (arc0_b == 0.0f && arc0_e == half_pi)
    {
        draw_list->PathArcToFast(ImVec2(x0, p1.y - rounding), rounding, 3, 6); // BL
        draw_list->PathArcToFast(ImVec2(x0, p0.y + rounding), rounding, 6, 9); // TR
    }
    else
    {
        draw_list->PathArcTo(ImVec2(x0, p1.y - rounding), rounding, IM_PI - arc0_e, IM_PI - arc0_b); // BL
        draw_list->PathArcTo(ImVec2(x0, p0.y + rounding), rounding, IM_PI + arc0_b, IM_PI + arc0_e); // TR
    }
    if (p1.x > rect.Min.x + rounding)
    {
        const float arc1_b = ImAcos01(1.0f - (rect.Max.x - p1.x) * inv_rounding);
        const float arc1_e = ImAcos01(1.0f - (rect.Max.x - p0.x) * inv_rounding);
        const float x1 = ImMin(p1.x, rect.Max.x - rounding);
        if (arc1_b == arc1_e)
        {
            draw_list->PathLineTo(ImVec2(x1, p0.y));
            draw_list->PathLineTo(ImVec2(x1, p1.y));
        }
        else if (arc1_b == 0.0f && arc1_e == half_pi)
        {
            draw_list->PathArcToFast(ImVec2(x1, p0.y + rounding), rounding, 9, 12); // TR
            draw_list->PathArcToFast(ImVec2(x1, p1.y - rounding), rounding, 0, 3);  // BR
        }
        else
        {
            draw_list->PathArcTo(ImVec2(x1, p0.y + rounding), rounding, -arc1_e, -arc1_b); // TR
            draw_list->PathArcTo(ImVec2(x1, p1.y - rounding), rounding, +arc1_b, +arc1_e); // BR
        }
    }
    draw_list->PathFillConvex(col);
}